

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  pointer pcVar4;
  size_t sVar5;
  size_t __n;
  ulong uVar6;
  pointer pcVar7;
  
  sVar1 = (a->piece_)._M_len;
  if ((sVar1 != 0) &&
     ((ulong)((long)(a->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xd3,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = (b->piece_)._M_len;
  if ((sVar2 != 0) &&
     ((ulong)((long)(b->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= dest->_M_string_length))
  {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xd4,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar3 = (c->piece_)._M_len;
  if (sVar3 == 0) {
    uVar6 = dest->_M_string_length;
  }
  else {
    uVar6 = dest->_M_string_length;
    if ((ulong)((long)(c->piece_)._M_str - (long)(dest->_M_dataplus)._M_p) <= uVar6) {
      __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                    ,0xd5,
                    "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                   );
    }
  }
  strings_internal::
  AppendUninitializedTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::Append(dest,sVar2 + sVar1 + sVar3);
  pcVar4 = (dest->_M_dataplus)._M_p;
  pcVar7 = pcVar4 + uVar6;
  sVar5 = (a->piece_)._M_len;
  if (sVar5 != 0) {
    memcpy(pcVar7,(a->piece_)._M_str,sVar5);
  }
  pcVar7 = pcVar7 + sVar5;
  sVar5 = (b->piece_)._M_len;
  if (sVar5 != 0) {
    memcpy(pcVar7,(b->piece_)._M_str,sVar5);
  }
  __n = (c->piece_)._M_len;
  if (__n != 0) {
    memcpy(pcVar7 + sVar5,(c->piece_)._M_str,__n);
  }
  if (pcVar7 + sVar5 + __n == pcVar4 + dest->_M_string_length) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xdd,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size() + c.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + dest->size());
}